

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spectrum.cpp
# Opt level: O0

optional<Storage::Tape::ZXSpectrum::Block> __thiscall
Storage::Tape::ZXSpectrum::Parser::find_block(Parser *this,shared_ptr<Storage::Tape::Tape> *tape)

{
  bool bVar1;
  uchar *puVar2;
  Block local_26 [2];
  _Optional_payload_base<unsigned_char> local_24 [2];
  Block block;
  optional<unsigned_char> type;
  shared_ptr<Storage::Tape::Tape> *psStack_20;
  shared_ptr<Storage::Tape::Tape> *tape_local;
  Parser *this_local;
  
  psStack_20 = tape;
  bVar1 = should_detect_speed(this);
  if (bVar1) {
    this->speed_phase_ = WaitingForGap;
  }
  Parser<Storage::Tape::ZXSpectrum::SymbolType>::proceed_to_symbol
            ((Parser<Storage::Tape::ZXSpectrum::SymbolType> *)this,psStack_20,Pilot);
  bVar1 = Parser<Storage::Tape::ZXSpectrum::SymbolType>::is_at_end
                    ((Parser<Storage::Tape::ZXSpectrum::SymbolType> *)this,psStack_20);
  if (bVar1) {
    std::optional<Storage::Tape::ZXSpectrum::Block>::optional
              ((optional<Storage::Tape::ZXSpectrum::Block> *)((long)&this_local + 6));
  }
  else {
    Parser<Storage::Tape::ZXSpectrum::SymbolType>::proceed_to_symbol
              ((Parser<Storage::Tape::ZXSpectrum::SymbolType> *)this,psStack_20,Zero);
    bVar1 = Parser<Storage::Tape::ZXSpectrum::SymbolType>::is_at_end
                      ((Parser<Storage::Tape::ZXSpectrum::SymbolType> *)this,psStack_20);
    if (bVar1) {
      std::optional<Storage::Tape::ZXSpectrum::Block>::optional
                ((optional<Storage::Tape::ZXSpectrum::Block> *)((long)&this_local + 6));
    }
    else {
      local_24[0] = (_Optional_payload_base<unsigned_char>)get_byte(this,psStack_20);
      bVar1 = std::optional::operator_cast_to_bool((optional *)local_24);
      if (bVar1) {
        puVar2 = std::optional<unsigned_char>::operator*((optional<unsigned_char> *)local_24);
        local_26[0].type = *puVar2;
        std::optional<Storage::Tape::ZXSpectrum::Block>::
        optional<Storage::Tape::ZXSpectrum::Block,_true>
                  ((optional<Storage::Tape::ZXSpectrum::Block> *)((long)&this_local + 6),local_26);
      }
      else {
        std::optional<Storage::Tape::ZXSpectrum::Block>::optional
                  ((optional<Storage::Tape::ZXSpectrum::Block> *)((long)&this_local + 6));
      }
    }
  }
  return (_Optional_base<Storage::Tape::ZXSpectrum::Block,_true,_true>)
         (_Optional_base<Storage::Tape::ZXSpectrum::Block,_true,_true>)this_local._6_2_;
}

Assistant:

std::optional<Block> Parser::find_block(const std::shared_ptr<Storage::Tape::Tape> &tape) {
	// Decide whether to kick off a speed detection phase.
	if(should_detect_speed()) {
		speed_phase_ = SpeedDetectionPhase::WaitingForGap;
	}

	// Find pilot tone.
	proceed_to_symbol(tape, SymbolType::Pilot);
	if(is_at_end(tape)) return std::nullopt;

	// Find sync bit.
	proceed_to_symbol(tape, SymbolType::Zero);
	if(is_at_end(tape)) return std::nullopt;

	// Read marker byte.
	const auto type = get_byte(tape);
	if(!type) return std::nullopt;

	// That succeeded.
	Block block = {
		.type = *type
	};
	return block;
}